

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

ZSTD_CDict *
ZSTD_initStaticCDict
          (void *workspace,size_t workspaceSize,void *dict,size_t dictSize,
          ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType,
          ZSTD_compressionParameters cParams)

{
  ZSTD_CDict *cdict;
  size_t sVar1;
  long lVar2;
  long lVar3;
  ZSTD_cwksp local_70;
  
  lVar2 = 4L << ((byte)cParams.chainLog & 0x3f);
  if (cParams.strategy == ZSTD_fast) {
    lVar2 = 0;
  }
  lVar3 = (dictSize + 7 & 0xfffffffffffffff8) + 0x2b40;
  if (dictLoadMethod == ZSTD_dlm_byRef) {
    lVar3 = 0x2b40;
  }
  if (((ulong)workspace & 7) == 0) {
    ZSTD_cwksp_init(&local_70,workspace,workspaceSize);
    cdict = (ZSTD_CDict *)ZSTD_cwksp_reserve_object(&local_70,0x1340);
    if (cdict != (ZSTD_CDict *)0x0) {
      (cdict->workspace).tableValidEnd = local_70.tableValidEnd;
      (cdict->workspace).allocStart = local_70.allocStart;
      (cdict->workspace).allocFailed = local_70.allocFailed;
      (cdict->workspace).workspaceOversizedDuration = local_70.workspaceOversizedDuration;
      (cdict->workspace).phase = local_70.phase;
      *(undefined4 *)&(cdict->workspace).field_0x3c = local_70._60_4_;
      (cdict->workspace).workspace = local_70.workspace;
      (cdict->workspace).workspaceEnd = local_70.workspaceEnd;
      (cdict->workspace).objectEnd = local_70.objectEnd;
      (cdict->workspace).tableEnd = local_70.tableEnd;
      if ((ulong)(lVar2 + lVar3 + (4L << ((byte)cParams.hashLog & 0x3f))) <= workspaceSize) {
        sVar1 = ZSTD_initCDict_internal(cdict,dict,dictSize,dictLoadMethod,dictContentType,cParams);
        if (sVar1 < 0xffffffffffffff89) {
          return cdict;
        }
        return (ZSTD_CDict *)0x0;
      }
    }
  }
  return (ZSTD_CDict *)0x0;
}

Assistant:

const ZSTD_CDict* ZSTD_initStaticCDict(
                                 void* workspace, size_t workspaceSize,
                           const void* dict, size_t dictSize,
                                 ZSTD_dictLoadMethod_e dictLoadMethod,
                                 ZSTD_dictContentType_e dictContentType,
                                 ZSTD_compressionParameters cParams)
{
    size_t const matchStateSize = ZSTD_sizeof_matchState(&cParams, /* forCCtx */ 0);
    size_t const neededSize = ZSTD_cwksp_alloc_size(sizeof(ZSTD_CDict))
                            + (dictLoadMethod == ZSTD_dlm_byRef ? 0
                               : ZSTD_cwksp_alloc_size(ZSTD_cwksp_align(dictSize, sizeof(void*))))
                            + ZSTD_cwksp_alloc_size(HUF_WORKSPACE_SIZE)
                            + matchStateSize;
    ZSTD_CDict* cdict;

    if ((size_t)workspace & 7) return NULL;  /* 8-aligned */

    {
        ZSTD_cwksp ws;
        ZSTD_cwksp_init(&ws, workspace, workspaceSize);
        cdict = (ZSTD_CDict*)ZSTD_cwksp_reserve_object(&ws, sizeof(ZSTD_CDict));
        if (cdict == NULL) return NULL;
        ZSTD_cwksp_move(&cdict->workspace, &ws);
    }

    DEBUGLOG(4, "(workspaceSize < neededSize) : (%u < %u) => %u",
        (unsigned)workspaceSize, (unsigned)neededSize, (unsigned)(workspaceSize < neededSize));
    if (workspaceSize < neededSize) return NULL;

    if (ZSTD_isError( ZSTD_initCDict_internal(cdict,
                                              dict, dictSize,
                                              dictLoadMethod, dictContentType,
                                              cParams) ))
        return NULL;

    return cdict;
}